

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O2

int SUNMemoryHelper_Dealloc(SUNMemoryHelper helper,SUNMemory mem,void *queue)

{
  int iVar1;
  
  if (mem != (SUNMemory)0x0) {
    iVar1 = (*helper->ops->dealloc)(helper,mem,queue);
    return iVar1;
  }
  return 0;
}

Assistant:

int SUNMemoryHelper_Dealloc(SUNMemoryHelper helper, SUNMemory mem, void* queue)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  if (helper->ops->dealloc == NULL)
    ier = -1;

  if (mem == NULL)
    ier = 0;
  else
    ier = helper->ops->dealloc(helper, mem, queue);

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return(ier);
}